

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgParticleSwarm.hpp
# Opt level: O1

void __thiscall TasOptimization::ParticleSwarmState::clearCache(ParticleSwarmState *this)

{
  uint uVar1;
  pointer pdVar2;
  pointer pdVar3;
  ulong *puVar4;
  ulong *puVar5;
  
  this->cache_initialized = false;
  pdVar2 = (this->cache_particle_fvals).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (this->cache_particle_fvals).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar2 != pdVar3) {
    memset(pdVar2,0,((long)pdVar3 + (-8 - (long)pdVar2) & 0xfffffffffffffff8U) + 8);
  }
  puVar5 = (this->cache_particle_inside).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  puVar4 = (this->cache_particle_inside).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
  uVar1 = (this->cache_particle_inside).super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
  if (puVar5 != puVar4) {
    memset(puVar5,0,(long)puVar4 - (long)puVar5);
    puVar5 = puVar4;
  }
  if (uVar1 != 0) {
    *puVar5 = *puVar5 & ~(0xffffffffffffffffU >> (-(char)uVar1 & 0x3fU));
  }
  pdVar2 = (this->cache_best_particle_fvals).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pdVar3 = (this->cache_best_particle_fvals).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pdVar2 != pdVar3) {
    memset(pdVar2,0,((long)pdVar3 + (-8 - (long)pdVar2) & 0xfffffffffffffff8U) + 8);
  }
  puVar5 = (this->cache_best_particle_inside).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  puVar4 = (this->cache_best_particle_inside).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
  uVar1 = (this->cache_best_particle_inside).super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
  if (puVar5 != puVar4) {
    memset(puVar5,0,(long)puVar4 - (long)puVar5);
    puVar5 = puVar4;
  }
  if (uVar1 != 0) {
    *puVar5 = *puVar5 & ~(0xffffffffffffffffU >> (-(char)uVar1 & 0x3fU));
  }
  return;
}

Assistant:

void clearCache() {
        cache_initialized = false;
        std::fill(cache_particle_fvals.begin(), cache_particle_fvals.end(), 0.0);
        std::fill(cache_particle_inside.begin(), cache_particle_inside.end(), false);
        std::fill(cache_best_particle_fvals.begin(), cache_best_particle_fvals.end(), 0.0);
        std::fill(cache_best_particle_inside.begin(), cache_best_particle_inside.end(), false);
    }